

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O0

SUNErrCode
SUNDataNode_CreateList
          (SUNDataIOMode io_mode,sundataindex num_elements,SUNContext_conflict sunctx,
          SUNDataNode *node_out)

{
  SUNContext_conflict in_RCX;
  sundataindex in_RDX;
  int in_EDI;
  SUNErrCode err;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_2c;
  
  if (in_EDI == 0) {
    local_2c = SUNDataNode_CreateList_InMem(in_RDX,in_RCX,(SUNDataNode *)in_RDX);
  }
  else {
    local_2c = -0x270d;
  }
  return local_2c;
}

Assistant:

SUNErrCode SUNDataNode_CreateList(SUNDataIOMode io_mode,
                                  sundataindex num_elements, SUNContext sunctx,
                                  SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  SUNErrCode err = SUN_SUCCESS;
  switch (io_mode)
  {
  case (SUNDATAIOMODE_INMEM):
    err = SUNDataNode_CreateList_InMem(num_elements, sunctx, node_out);
    break;
  default: err = SUN_ERR_ARG_OUTOFRANGE;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);

  SUNCheck(err == SUN_SUCCESS, err);

  return err;
}